

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

Path * Path::home(void)

{
  bool bVar1;
  char *ch;
  String *in_RDI;
  Path local_50;
  String local_30;
  
  ch = getenv("HOME");
  String::String(&local_30,ch,0xffffffffffffffff);
  local_50.super_String.mString._M_dataplus._M_p = (pointer)&local_50.super_String.mString.field_2;
  local_50.super_String.mString._M_string_length = 0;
  local_50.super_String.mString.field_2._M_local_buf[0] = '\0';
  resolved((Path *)in_RDI,&local_30,RealPath,&local_50,(bool *)0x0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  bVar1 = String::endsWith(in_RDI,'/',CaseSensitive);
  if (!bVar1) {
    std::__cxx11::string::push_back((char)in_RDI);
  }
  return (Path *)in_RDI;
}

Assistant:

Path Path::home()
{
#ifdef _WIN32
    Path ret;

    // on windows, there is no definite "home" directory. If the HOME
    // environment variable is set, we use it. Otherwise, we use %USERPROFILE%,
    // which defaults to C:\User\<username>.
    // If %USERPROFILE% is not set, we use c:\.
    char *env;
    if((env = getenv("HOME")))
    {
        ret = env;
    }
    else if((env = getenv("USERPROFILE")))
    {
        ret = env;
    }
    else
    {
        ret = "c:/";
    }
#else
    Path ret = Path::resolved(getenv("HOME"));
#endif
    if (!ret.endsWith('/'))
        ret.append('/');
    return ret;
}